

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O0

void skiwi::visitor<skiwi::If,_skiwi::(anonymous_namespace)::macro_finder_visitor>::visit
               (If *i,macro_finder_visitor *v)

{
  bool bVar1;
  uint uVar2;
  reference exp;
  variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
  *arg;
  iterator __end3;
  iterator __begin3;
  vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
  *__range3;
  macro_finder_visitor *v_local;
  If *i_local;
  
  uVar2 = (*(v->super_base_visitor<skiwi::(anonymous_namespace)::macro_finder_visitor>).
            _vptr_base_visitor[0xd])(v,i);
  if ((uVar2 & 1) != 0) {
    __end3 = std::
             vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
             ::begin(&i->arguments);
    arg = (variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
           *)std::
             vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
             ::end(&i->arguments);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
                                       *)&arg), bVar1) {
      exp = __gnu_cxx::
            __normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
            ::operator*(&__end3);
      visitor<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_skiwi::(anonymous_namespace)::macro_finder_visitor>
      ::visit(exp,v);
      __gnu_cxx::
      __normal_iterator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_*,_std::vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>_>
      ::operator++(&__end3);
    }
  }
  (*(v->super_base_visitor<skiwi::(anonymous_namespace)::macro_finder_visitor>)._vptr_base_visitor
    [0x26])(v,i);
  return;
}

Assistant:

static void visit(If& i, T* v)
    {
    if (((typename T::base*)v)->_previsit(i))
      for (auto& arg : i.arguments)
        visitor<Expression, T>::visit(arg, v);
    ((typename T::base*)v)->_postvisit(i);
    }